

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrapper.cpp
# Opt level: O0

void * custommalloc(size_t __size)

{
  bool bVar1;
  TheCustomHeapType *this;
  bool *pbVar2;
  void *ptr;
  void *ptr_1;
  void *ptr_2;
  char *local_8;
  
  bVar1 = isCustomHeapInitialized();
  if (bVar1) {
    this = getCustomHeap();
    local_8 = (char *)HL::
                      ANSIWrapper<Hoard::ThreadLocalAllocationBuffer<15,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getSizeClass,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getClassSize,_1024UL,_16777216UL,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_262144U,_Hoard::HoardHeapType>_>
                      ::malloc(this,__size);
    if (local_8 == (char *)0x0) {
      fprintf(_stderr,"INTERNAL FAILURE.\n");
      abort();
    }
  }
  else {
    pbVar2 = (bool *)(initBufferPtr + __size);
    if (&xxmalloc::initialized < pbVar2) {
      initBufferPtr = pbVar2;
      abort();
    }
    if ((xxmalloc::initialized & 1U) == 0) {
      xxmalloc::initialized = true;
    }
    local_8 = initBufferPtr;
    initBufferPtr = pbVar2;
  }
  return local_8;
}

Assistant:

FLATTEN void * MYCDECL CUSTOM_MALLOC(size_t sz)
{
  void * ptr = xxmalloc(sz);
  return ptr;
}